

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xorfilter.h
# Opt level: O1

_Bool xor16_populate_gen(uint64_t *keys,uint32_t size,void *filter)

{
  ulong *puVar1;
  undefined4 uVar2;
  ulong uVar3;
  size_t __size;
  uint uVar4;
  void *__s;
  void *__ptr;
  void *__ptr_00;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  int *piVar13;
  long lVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  ushort uVar21;
  undefined4 *puVar22;
  uint32_t r0;
  ulong local_c0;
  ulong local_98;
  
  if (size == 0) {
    return false;
  }
  local_c0 = (ulong)size;
  *(undefined8 *)filter = 0x910a2dec89025cc1;
  uVar3 = *(ulong *)((long)filter + 8);
  lVar11 = uVar3 * 0x10;
  __size = uVar3 * 0x30;
  __s = malloc(__size);
  __ptr = malloc(__size);
  __ptr_00 = malloc(local_c0 << 4);
  iVar15 = 0;
  if (__ptr_00 != (void *)0x0 && (__ptr != (void *)0x0 && __s != (void *)0x0)) {
    lVar5 = uVar3 * 0x20;
    local_98 = 0x9e3779b97f4a7c16;
    while( true ) {
      if (iVar15 + 1 == 10) {
        local_c0 = xor_sort_and_remove_dup(keys,local_c0 & 0xffffffff);
      }
      if (iVar15 == 100) {
        iVar15 = 0;
        goto LAB_001025aa;
      }
      memset(__s,0,__size);
      uVar6 = local_c0 & 0xffffffff;
      if ((int)local_c0 != 0) {
        lVar9 = *filter;
        uVar8 = (ulong)*(uint *)((long)filter + 8);
        uVar12 = 0;
        do {
          uVar16 = (keys[uVar12] + lVar9 >> 0x21 ^ keys[uVar12] + lVar9) * -0xae502812aa7333;
          uVar16 = (uVar16 >> 0x21 ^ uVar16) * -0x3b314601e57a13ad;
          uVar17 = uVar16 >> 0x21 ^ uVar16;
          uVar20 = (uVar17 & 0xffffffff) * uVar8 >> 0x1c & 0xfffffffffffffff0;
          puVar1 = (ulong *)((long)__s + uVar20);
          *puVar1 = *puVar1 ^ uVar17;
          piVar13 = (int *)((long)__s + uVar20 + 8);
          *piVar13 = *piVar13 + 1;
          uVar16 = ((uint)(uVar17 << 0x15) | (uint)(uVar16 >> 0x2b)) * uVar8 >> 0x1c &
                   0xfffffffffffffff0;
          puVar1 = (ulong *)((long)__s + uVar16 + lVar11);
          *puVar1 = *puVar1 ^ uVar17;
          piVar13 = (int *)((long)__s + uVar16 + lVar11 + 8);
          *piVar13 = *piVar13 + 1;
          uVar16 = (uVar17 >> 0x16 & 0xffffffff) * uVar8 >> 0x1c & 0xfffffffffffffff0;
          puVar1 = (ulong *)((long)__s + uVar16 + lVar5);
          *puVar1 = *puVar1 ^ uVar17;
          piVar13 = (int *)((long)__s + uVar16 + lVar5 + 8);
          *piVar13 = *piVar13 + 1;
          uVar12 = uVar12 + 1;
        } while (uVar6 != uVar12);
      }
      uVar8 = *(ulong *)((long)filter + 8);
      if (uVar8 == 0) {
        lVar9 = 0;
      }
      else {
        lVar9 = 0;
        uVar12 = 0;
        piVar13 = (int *)((long)__s + 8);
        do {
          if (*piVar13 == 1) {
            *(int *)((long)__ptr + lVar9 * 0x10 + 8) = (int)uVar12;
            *(undefined8 *)((long)__ptr + lVar9 * 0x10) = *(undefined8 *)(piVar13 + -2);
            lVar9 = lVar9 + 1;
          }
          uVar12 = uVar12 + 1;
          piVar13 = piVar13 + 4;
        } while (uVar8 != uVar12);
      }
      if (uVar8 == 0) {
        lVar14 = 0;
      }
      else {
        lVar14 = 0;
        uVar12 = 0;
        piVar13 = (int *)((long)__s + lVar11 + 8);
        do {
          if (*piVar13 == 1) {
            *(int *)((long)__ptr + lVar14 * 0x10 + lVar11 + 8) = (int)uVar12;
            *(undefined8 *)((long)__ptr + lVar14 * 0x10 + lVar11) = *(undefined8 *)(piVar13 + -2);
            lVar14 = lVar14 + 1;
          }
          uVar12 = uVar12 + 1;
          piVar13 = piVar13 + 4;
        } while (uVar8 != uVar12);
      }
      if (uVar8 == 0) {
        lVar18 = 0;
      }
      else {
        lVar18 = 0;
        uVar12 = 0;
        piVar13 = (int *)((long)__s + lVar5 + 8);
        do {
          if (*piVar13 == 1) {
            *(int *)((long)__ptr + lVar18 * 0x10 + lVar5 + 8) = (int)uVar12;
            *(undefined8 *)((long)__ptr + lVar18 * 0x10 + lVar5) = *(undefined8 *)(piVar13 + -2);
            lVar18 = lVar18 + 1;
          }
          uVar12 = uVar12 + 1;
          piVar13 = piVar13 + 4;
        } while (uVar8 != uVar12);
      }
      if (lVar14 + lVar9 + lVar18 == 0) {
        uVar16 = 0;
      }
      else {
        uVar12 = uVar8 & 0xffffffff;
        uVar16 = 0;
        do {
          if (lVar9 != 0) {
            puVar22 = (undefined4 *)((long)__ptr + lVar9 * 0x10 + -4);
            do {
              uVar4 = puVar22[-1];
              if (*(int *)((long)__s + (ulong)uVar4 * 0x10 + 8) != 0) {
                uVar17 = *(ulong *)(puVar22 + -3);
                uVar2 = *puVar22;
                uVar20 = ((uint)(uVar17 << 0x15) | (uint)(uVar17 >> 0x2b)) * uVar12;
                lVar19 = uVar16 * 0x10;
                *(ulong *)((long)__ptr_00 + lVar19) = uVar17;
                *(uint *)((long)__ptr_00 + lVar19 + 8) = uVar4;
                *(undefined4 *)((long)__ptr_00 + lVar19 + 0xc) = uVar2;
                lVar19 = (uVar20 >> 0x20) * 0x10;
                uVar7 = *(ulong *)((long)__s + lVar19 + lVar11) ^ uVar17;
                *(ulong *)((long)__s + lVar19 + lVar11) = uVar7;
                iVar10 = *(int *)((long)__s + lVar19 + lVar11 + 8) + -1;
                *(int *)((long)__s + lVar19 + lVar11 + 8) = iVar10;
                if (iVar10 == 1) {
                  *(int *)((long)__ptr + lVar14 * 0x10 + lVar11 + 8) = (int)(uVar20 >> 0x20);
                  *(ulong *)((long)__ptr + lVar14 * 0x10 + lVar11) = uVar7;
                  lVar14 = lVar14 + 1;
                }
                uVar20 = (uVar17 >> 0x16 & 0xffffffff) * uVar12;
                uVar16 = uVar16 + 1;
                lVar19 = (uVar20 >> 0x20) * 0x10;
                uVar17 = uVar17 ^ *(ulong *)((long)__s + lVar19 + lVar5);
                *(ulong *)((long)__s + lVar19 + lVar5) = uVar17;
                iVar10 = *(int *)((long)__s + lVar19 + lVar5 + 8) + -1;
                *(int *)((long)__s + lVar19 + lVar5 + 8) = iVar10;
                if (iVar10 == 1) {
                  *(int *)((long)__ptr + lVar18 * 0x10 + lVar5 + 8) = (int)(uVar20 >> 0x20);
                  *(ulong *)((long)__ptr + lVar18 * 0x10 + lVar5) = uVar17;
                  lVar18 = lVar18 + 1;
                }
              }
              lVar9 = lVar9 + -1;
              puVar22 = puVar22 + -4;
            } while (lVar9 != 0);
          }
          if (lVar14 == 0) {
            lVar9 = 0;
          }
          else {
            puVar22 = (undefined4 *)((long)__ptr + lVar14 * 0x10 + lVar11 + -4);
            lVar9 = 0;
            do {
              uVar4 = puVar22[-1];
              if (*(int *)((long)__s + (ulong)uVar4 * 0x10 + lVar11 + 8) != 0) {
                uVar17 = *(ulong *)(puVar22 + -3);
                uVar2 = *puVar22;
                uVar20 = (uVar17 & 0xffffffff) * uVar12;
                lVar19 = uVar16 * 0x10;
                *(ulong *)((long)__ptr_00 + lVar19) = uVar17;
                *(uint *)((long)__ptr_00 + lVar19 + 8) = uVar4 + (int)uVar3;
                *(undefined4 *)((long)__ptr_00 + lVar19 + 0xc) = uVar2;
                lVar19 = (uVar20 >> 0x20) * 0x10;
                uVar7 = *(ulong *)((long)__s + lVar19) ^ uVar17;
                *(ulong *)((long)__s + lVar19) = uVar7;
                iVar10 = *(int *)((long)__s + lVar19 + 8) + -1;
                *(int *)((long)__s + lVar19 + 8) = iVar10;
                if (iVar10 == 1) {
                  *(int *)((long)__ptr + lVar9 * 0x10 + 8) = (int)(uVar20 >> 0x20);
                  *(ulong *)((long)__ptr + lVar9 * 0x10) = uVar7;
                  lVar9 = lVar9 + 1;
                }
                uVar20 = (uVar17 >> 0x16 & 0xffffffff) * uVar12;
                uVar16 = uVar16 + 1;
                lVar19 = (uVar20 >> 0x20) * 0x10;
                uVar17 = uVar17 ^ *(ulong *)((long)__s + lVar19 + lVar5);
                *(ulong *)((long)__s + lVar19 + lVar5) = uVar17;
                iVar10 = *(int *)((long)__s + lVar19 + lVar5 + 8) + -1;
                *(int *)((long)__s + lVar19 + lVar5 + 8) = iVar10;
                if (iVar10 == 1) {
                  *(int *)((long)__ptr + lVar18 * 0x10 + lVar5 + 8) = (int)(uVar20 >> 0x20);
                  *(ulong *)((long)__ptr + lVar18 * 0x10 + lVar5) = uVar17;
                  lVar18 = lVar18 + 1;
                }
              }
              lVar14 = lVar14 + -1;
              puVar22 = puVar22 + -4;
            } while (lVar14 != 0);
          }
          if (lVar18 == 0) {
            lVar14 = 0;
          }
          else {
            puVar22 = (undefined4 *)((long)__ptr + lVar18 * 0x10 + lVar5 + -4);
            lVar14 = 0;
            do {
              uVar4 = puVar22[-1];
              if (*(int *)((long)__s + (ulong)uVar4 * 0x10 + lVar5 + 8) != 0) {
                uVar17 = *(ulong *)(puVar22 + -3);
                uVar2 = *puVar22;
                uVar20 = (uVar17 & 0xffffffff) * uVar12;
                lVar19 = uVar16 * 0x10;
                *(ulong *)((long)__ptr_00 + lVar19) = uVar17;
                *(uint *)((long)__ptr_00 + lVar19 + 8) = uVar4 + (int)uVar3 * 2;
                *(undefined4 *)((long)__ptr_00 + lVar19 + 0xc) = uVar2;
                lVar19 = (uVar20 >> 0x20) * 0x10;
                uVar7 = *(ulong *)((long)__s + lVar19) ^ uVar17;
                *(ulong *)((long)__s + lVar19) = uVar7;
                iVar10 = *(int *)((long)__s + lVar19 + 8) + -1;
                *(int *)((long)__s + lVar19 + 8) = iVar10;
                if (iVar10 == 1) {
                  *(int *)((long)__ptr + lVar9 * 0x10 + 8) = (int)(uVar20 >> 0x20);
                  *(ulong *)((long)__ptr + lVar9 * 0x10) = uVar7;
                  lVar9 = lVar9 + 1;
                }
                uVar20 = ((uint)(uVar17 << 0x15) | (uint)(uVar17 >> 0x2b)) * uVar12;
                uVar16 = uVar16 + 1;
                lVar19 = (uVar20 >> 0x20) * 0x10;
                uVar17 = uVar17 ^ *(ulong *)((long)__s + lVar19 + lVar11);
                *(ulong *)((long)__s + lVar19 + lVar11) = uVar17;
                iVar10 = *(int *)((long)__s + lVar19 + lVar11 + 8) + -1;
                *(int *)((long)__s + lVar19 + lVar11 + 8) = iVar10;
                if (iVar10 == 1) {
                  *(int *)((long)__ptr + lVar14 * 0x10 + lVar11 + 8) = (int)(uVar20 >> 0x20);
                  *(ulong *)((long)__ptr + lVar14 * 0x10 + lVar11) = uVar17;
                  lVar14 = lVar14 + 1;
                }
              }
              lVar18 = lVar18 + -1;
              puVar22 = puVar22 + -4;
            } while (lVar18 != 0);
          }
          lVar18 = 0;
        } while (lVar9 + lVar14 != 0);
      }
      if (uVar16 == uVar6) break;
      local_98 = local_98 + 0x9e3779b97f4a7c15;
      uVar6 = (local_98 >> 0x1e ^ local_98) * -0x40a7b892e31b1a47;
      uVar6 = (uVar6 >> 0x1b ^ uVar6) * -0x6b2fb644ecceee15;
      *(ulong *)filter = uVar6 >> 0x1f ^ uVar6;
      iVar15 = iVar15 + 1;
    }
    iVar15 = 1;
    if ((int)local_c0 != 0) {
      lVar5 = *(long *)((long)filter + 0x10);
      lVar11 = lVar5 + uVar3 * 2;
      uVar8 = uVar8 & 0xffffffff;
      lVar9 = uVar6 << 4;
      do {
        uVar6 = *(ulong *)((long)__ptr_00 + lVar9 + -0x10);
        uVar12 = (ulong)*(uint *)((long)__ptr_00 + lVar9 + -8);
        uVar4 = (uint)(uVar6 >> 0x20);
        if (uVar12 < uVar3) {
          uVar21 = *(ushort *)
                    (lVar11 + (((uint)(uVar6 << 0x15) | uVar4 >> 0xb) * uVar8 >> 0x20) * 2);
LAB_00102554:
          uVar4 = (uint)(uVar6 >> 0x16);
          lVar14 = lVar5 + uVar3 * 4;
        }
        else {
          uVar21 = *(ushort *)(lVar5 + ((uVar6 & 0xffffffff) * uVar8 >> 0x20) * 2);
          if (uVar12 < uVar3 * 2) goto LAB_00102554;
          uVar4 = (uint)(uVar6 << 0x15) | uVar4 >> 0xb;
          lVar14 = lVar11;
        }
        *(ushort *)(lVar5 + uVar12 * 2) =
             (ushort)(uVar6 >> 0x20) ^ (ushort)uVar6 ^
             uVar21 ^ *(ushort *)(lVar14 + (uVar4 * uVar8 >> 0x20) * 2);
        lVar9 = lVar9 + -0x10;
      } while (lVar9 != 0);
      iVar15 = 1;
    }
  }
LAB_001025aa:
  free(__s);
  free(__ptr);
  free(__ptr_00);
  return SUB41(iVar15,0);
}

Assistant:

static inline bool xor16_populate(uint64_t *keys, uint32_t size, xor16_t *filter) {
  if(size == 0) { return false; }
  uint64_t rng_counter = 1;
  filter->seed = xor_rng_splitmix64(&rng_counter);
  size_t arrayLength = (size_t)(filter->blockLength) * 3; // size of the backing array
  size_t blockLength = (size_t)(filter->blockLength);

  xor_xorset_t *sets =
      (xor_xorset_t *)malloc(arrayLength * sizeof(xor_xorset_t));

  xor_keyindex_t *Q =
      (xor_keyindex_t *)malloc(arrayLength * sizeof(xor_keyindex_t));

  xor_keyindex_t *stack =
      (xor_keyindex_t *)malloc(size * sizeof(xor_keyindex_t));

  if ((sets == NULL) || (Q == NULL) || (stack == NULL)) {
    free(sets);
    free(Q);
    free(stack);
    return false;
  }
  xor_xorset_t *sets0 = sets;
  xor_xorset_t *sets1 = sets + blockLength;
  xor_xorset_t *sets2 = sets + 2 * blockLength;

  xor_keyindex_t *Q0 = Q;
  xor_keyindex_t *Q1 = Q + blockLength;
  xor_keyindex_t *Q2 = Q + 2 * blockLength;

  int iterations = 0;

  while (true) {
    iterations ++;
    if(iterations == XOR_SORT_ITERATIONS) {
      size = (uint32_t)xor_sort_and_remove_dup(keys, size);
    }
    if(iterations > XOR_MAX_ITERATIONS) {
      // The probability of this happening is lower than the
      // the cosmic-ray probability (i.e., a cosmic ray corrupts your system).
      free(sets);
      free(Q);
      free(stack);
      return false;
    }

    memset(sets, 0, sizeof(xor_xorset_t) * arrayLength);
    for (size_t i = 0; i < size; i++) {
      uint64_t key = keys[i];
      xor_hashes_t hs = xor16_get_h0_h1_h2(key, filter);
      sets0[hs.h0].xormask ^= hs.h;
      sets0[hs.h0].count++;
      sets1[hs.h1].xormask ^= hs.h;
      sets1[hs.h1].count++;
      sets2[hs.h2].xormask ^= hs.h;
      sets2[hs.h2].count++;
    }
    // todo: the flush should be sync with the detection that follows
    // scan for values with a count of one
    size_t Q0size = 0, Q1size = 0, Q2size = 0;
    for (size_t i = 0; i < filter->blockLength; i++) {
      if (sets0[i].count == 1) {
        Q0[Q0size].index = (uint32_t)i;
        Q0[Q0size].hash = sets0[i].xormask;
        Q0size++;
      }
    }

    for (size_t i = 0; i < filter->blockLength; i++) {
      if (sets1[i].count == 1) {
        Q1[Q1size].index = (uint32_t)i;
        Q1[Q1size].hash = sets1[i].xormask;
        Q1size++;
      }
    }
    for (size_t i = 0; i < filter->blockLength; i++) {
      if (sets2[i].count == 1) {
        Q2[Q2size].index = (uint32_t)i;
        Q2[Q2size].hash = sets2[i].xormask;
        Q2size++;
      }
    }

    size_t stack_size = 0;
    while (Q0size + Q1size + Q2size > 0) {
      while (Q0size > 0) {
        xor_keyindex_t keyindex = Q0[--Q0size];
        size_t index = keyindex.index;
        if (sets0[index].count == 0)
          continue; // not actually possible after the initial scan.
        //sets0[index].count = 0;
        uint64_t hash = keyindex.hash;
        uint32_t h1 = xor16_get_h1(hash, filter);
        uint32_t h2 = xor16_get_h2(hash, filter);

        stack[stack_size] = keyindex;
        stack_size++;
        sets1[h1].xormask ^= hash;
        sets1[h1].count--;
        if (sets1[h1].count == 1) {
          Q1[Q1size].index = h1;
          Q1[Q1size].hash = sets1[h1].xormask;
          Q1size++;
        }
        sets2[h2].xormask ^= hash;
        sets2[h2].count--;
        if (sets2[h2].count == 1) {
          Q2[Q2size].index = h2;
          Q2[Q2size].hash = sets2[h2].xormask;
          Q2size++;
        }
      }
      while (Q1size > 0) {
        xor_keyindex_t keyindex = Q1[--Q1size];
        size_t index = keyindex.index;
        if (sets1[index].count == 0)
          continue;
        //sets1[index].count = 0;
        uint64_t hash = keyindex.hash;
        uint32_t h0 = xor16_get_h0(hash, filter);
        uint32_t h2 = xor16_get_h2(hash, filter);
        keyindex.index += (uint32_t)blockLength;
        stack[stack_size] = keyindex;
        stack_size++;
        sets0[h0].xormask ^= hash;
        sets0[h0].count--;
        if (sets0[h0].count == 1) {
          Q0[Q0size].index = h0;
          Q0[Q0size].hash = sets0[h0].xormask;
          Q0size++;
        }
        sets2[h2].xormask ^= hash;
        sets2[h2].count--;
        if (sets2[h2].count == 1) {
          Q2[Q2size].index = h2;
          Q2[Q2size].hash = sets2[h2].xormask;
          Q2size++;
        }
      }
      while (Q2size > 0) {
        xor_keyindex_t keyindex = Q2[--Q2size];
        size_t index = keyindex.index;
        if (sets2[index].count == 0)
          continue;

        //sets2[index].count = 0;
        uint64_t hash = keyindex.hash;

        uint32_t h0 = xor16_get_h0(hash, filter);
        uint32_t h1 = xor16_get_h1(hash, filter);
        keyindex.index += 2 * (uint32_t)blockLength;

        stack[stack_size] = keyindex;
        stack_size++;
        sets0[h0].xormask ^= hash;
        sets0[h0].count--;
        if (sets0[h0].count == 1) {
          Q0[Q0size].index = h0;
          Q0[Q0size].hash = sets0[h0].xormask;
          Q0size++;
        }
        sets1[h1].xormask ^= hash;
        sets1[h1].count--;
        if (sets1[h1].count == 1) {
          Q1[Q1size].index = h1;
          Q1[Q1size].hash = sets1[h1].xormask;
          Q1size++;
        }

      }
    }
    if (stack_size == size) {
      // success
      break;
    }

    filter->seed = xor_rng_splitmix64(&rng_counter);
  }
  uint16_t * fingerprints0 = filter->fingerprints;
  uint16_t * fingerprints1 = filter->fingerprints + blockLength;
  uint16_t * fingerprints2 = filter->fingerprints + 2 * blockLength;

  size_t stack_size = size;
  while (stack_size > 0) {
    xor_keyindex_t ki = stack[--stack_size];
    uint64_t val = xor_fingerprint(ki.hash);
    if(ki.index < blockLength) {
      val ^= (uint32_t)fingerprints1[xor16_get_h1(ki.hash,filter)] ^ fingerprints2[xor16_get_h2(ki.hash,filter)];
    } else if(ki.index < 2 * blockLength) {
      val ^= (uint32_t)fingerprints0[xor16_get_h0(ki.hash,filter)] ^ fingerprints2[xor16_get_h2(ki.hash,filter)];
    } else {
      val ^= (uint32_t)fingerprints0[xor16_get_h0(ki.hash,filter)] ^ fingerprints1[xor16_get_h1(ki.hash,filter)];
    }
    filter->fingerprints[ki.index] = (uint16_t)val;
  }

  free(sets);
  free(Q);
  free(stack);
  return true;
}